

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qvarlengtharray.h
# Opt level: O0

void __thiscall
QVLABase<QList<int>_>::reallocate_impl
          (QVLABase<QList<int>_> *this,qsizetype prealloc,void *array,qsizetype asize,
          qsizetype aalloc)

{
  QList<int> *capacity;
  size_t headerSize;
  longlong *plVar1;
  QList<int> *pQVar2;
  long in_RCX;
  QList<int> *in_RDX;
  size_t in_RSI;
  QVLABaseBase *in_RDI;
  size_t in_R8;
  long in_FS_OFFSET;
  qsizetype newA;
  void *newPtr;
  qsizetype copySize;
  qsizetype oalloc;
  QList<int> *oldPtr;
  malloced_ptr guard;
  qsizetype osize;
  QList<int> *in_stack_ffffffffffffff88;
  qsizetype *capacity_00;
  size_type local_20;
  size_t local_18;
  long local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_18 = in_R8;
  local_10 = in_RCX;
  capacity = data((QVLABase<QList<int>_> *)in_RDI);
  local_20 = QVLABaseBase::size(in_RDI);
  headerSize = QVLABaseBase::capacity(in_RDI);
  plVar1 = qMin<long_long>(&local_10,&local_20);
  capacity_00 = (qsizetype *)*plVar1;
  if (local_18 != headerSize) {
    std::unique_ptr<void,QVLABaseBase::free_deleter>::unique_ptr<QVLABaseBase::free_deleter,void>
              ((unique_ptr<void,_QVLABaseBase::free_deleter> *)in_RDI);
    pQVar2 = in_RDX;
    if ((long)in_RSI < (long)local_18) {
      pQVar2 = (QList<int> *)
               QtPrivate::fittedMalloc(headerSize,capacity_00,0xaaaaaaaaaaaaaaaa,0xaaaaaaaaaaaaaaaa)
      ;
      std::unique_ptr<void,_QVLABaseBase::free_deleter>::reset
                ((unique_ptr<void,_QVLABaseBase::free_deleter> *)in_RDI,in_stack_ffffffffffffff88);
      qt_noop();
      in_RSI = local_18;
    }
    QtPrivate::q_uninitialized_relocate_n<QList<int>,long_long>
              ((QList<int> *)in_RDI,(longlong)in_stack_ffffffffffffff88,(QList<int> *)0x8c46ab);
    in_RDI->ptr = pQVar2;
    std::unique_ptr<void,_QVLABaseBase::free_deleter>::release
              ((unique_ptr<void,_QVLABaseBase::free_deleter> *)0x8c46c3);
    in_RDI->a = in_RSI;
    std::unique_ptr<void,_QVLABaseBase::free_deleter>::~unique_ptr
              ((unique_ptr<void,_QVLABaseBase::free_deleter> *)in_RDI);
  }
  in_RDI->s = (qsizetype)capacity_00;
  if (local_10 < local_20) {
    std::destroy<QList<int>*>((QList<int> *)in_RDI,in_stack_ffffffffffffff88);
  }
  if ((capacity != in_RDX) && (pQVar2 = data((QVLABase<QList<int>_> *)in_RDI), capacity != pQVar2))
  {
    QtPrivate::sizedFree(in_RDI,(size_t)capacity,0x8c4754);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

Q_OUTOFLINE_TEMPLATE void QVLABase<T>::reallocate_impl(qsizetype prealloc, void *array, qsizetype asize, qsizetype aalloc)
{
    Q_ASSERT(aalloc >= asize);
    Q_ASSERT(data());
    T *oldPtr = data();
    qsizetype osize = size();
    const qsizetype oalloc = capacity();

    const qsizetype copySize = qMin(asize, osize);
    Q_ASSERT(copySize >= 0);

    if (aalloc != oalloc) {
        QVLABaseBase::malloced_ptr guard;
        void *newPtr;
        qsizetype newA;
        if (aalloc > prealloc) {
            newPtr = QtPrivate::fittedMalloc(0, &aalloc, sizeof(T));
            guard.reset(newPtr);
            Q_CHECK_PTR(newPtr); // could throw
            // by design: in case of QT_NO_EXCEPTIONS malloc must not fail or it crashes here
            newA = aalloc;
        } else {
            newPtr = array;
            newA = prealloc;
        }
        QtPrivate::q_uninitialized_relocate_n(oldPtr, copySize,
                                              reinterpret_cast<T *>(newPtr));
        // commit:
        ptr = newPtr;
        guard.release();
        a = newA;
    }
    s = copySize;

    // destroy remaining old objects
    if constexpr (QTypeInfo<T>::isComplex) {
        if (osize > asize)
            std::destroy(oldPtr + asize, oldPtr + osize);
    }

    if (oldPtr != reinterpret_cast<T *>(array) && oldPtr != data())
        QtPrivate::sizedFree(oldPtr, oalloc, sizeof(T));
}